

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  pointer pcVar1;
  TargetType TVar2;
  string *psVar3;
  cmOSXBundleGenerator *this_00;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_005f2f98;
  (this->TargetNames).Base._M_dataplus._M_p = (pointer)&(this->TargetNames).Base.field_2;
  (this->TargetNames).Base._M_string_length = 0;
  (this->TargetNames).Base.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Output._M_dataplus._M_p = (pointer)&(this->TargetNames).Output.field_2;
  (this->TargetNames).Output._M_string_length = 0;
  (this->TargetNames).Output.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Real._M_dataplus._M_p = (pointer)&(this->TargetNames).Real.field_2;
  (this->TargetNames).Real._M_string_length = 0;
  (this->TargetNames).Real.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).ImportLibrary._M_dataplus._M_p =
       (pointer)&(this->TargetNames).ImportLibrary.field_2;
  (this->TargetNames).ImportLibrary._M_string_length = 0;
  (this->TargetNames).ImportLibrary.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).PDB._M_dataplus._M_p = (pointer)&(this->TargetNames).PDB.field_2;
  (this->TargetNames).PDB._M_string_length = 0;
  (this->TargetNames).PDB.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).SharedObject._M_dataplus._M_p =
       (pointer)&(this->TargetNames).SharedObject.field_2;
  (this->TargetNames).SharedObject._M_string_length = 0;
  (this->TargetNames).SharedObject.field_2._M_local_buf[0] = '\0';
  (this->TargetLinkLanguage)._M_dataplus._M_p = (pointer)&(this->TargetLinkLanguage).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->TargetLinkLanguage,"");
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_110,target,psVar3);
  std::__cxx11::string::operator=((string *)&this->TargetLinkLanguage,(string *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == EXECUTABLE) {
    cmGeneratorTarget::GetExecutableNames
              ((Names *)local_110,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).ConfigName);
  }
  else {
    cmGeneratorTarget::GetLibraryNames
              ((Names *)local_110,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).ConfigName);
  }
  std::__cxx11::string::operator=((string *)&this->TargetNames,(string *)local_110);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).Output,(string *)&local_f0);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).Real,(string *)&local_d0);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).ImportLibrary,(string *)&local_b0);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).PDB,(string *)&local_90);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).SharedObject,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != OBJECT_LIBRARY) {
    psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetDirectory((string *)local_110,target,psVar3,RuntimeBinaryArtifact);
    cmNinjaTargetGenerator::EnsureDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)local_110);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + psVar3->_M_string_length);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,&local_50);
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator)->MacContentFolders =
       &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetLinkLanguage("")
{
  this->TargetLinkLanguage = target->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    this->TargetNames = this->GetGeneratorTarget()->GetExecutableNames(
      GetLocalGenerator()->GetConfigName());
  } else {
    this->TargetNames = this->GetGeneratorTarget()->GetLibraryNames(
      GetLocalGenerator()->GetConfigName());
  }

  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->GetDirectory(this->GetConfigName()));
  }

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}